

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

mu * __thiscall llvm::APInt::magicu(mu *__return_storage_ptr__,APInt *this,uint LeadingZeros)

{
  anon_union_8_2_1313ab2f_for_U aVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  APInt q2;
  APInt r2;
  APInt q1;
  APInt r1;
  APInt signedMin;
  APInt nc;
  APInt allOnes;
  APInt signedMax;
  APInt delta;
  anon_union_8_2_1313ab2f_for_U local_248;
  uint local_240;
  anon_union_8_2_1313ab2f_for_U local_238;
  uint local_230;
  anon_union_8_2_1313ab2f_for_U local_228;
  uint local_220;
  anon_union_8_2_1313ab2f_for_U local_218;
  uint local_210;
  anon_union_8_2_1313ab2f_for_U local_208;
  uint local_200;
  mu *local_1f8;
  anon_union_8_2_1313ab2f_for_U local_1f0;
  uint local_1e8;
  anon_union_8_2_1313ab2f_for_U local_1e0;
  uint local_1d8;
  anon_union_8_2_1313ab2f_for_U local_1d0;
  uint local_1c8;
  anon_union_8_2_1313ab2f_for_U local_1c0;
  uint local_1b8;
  anon_union_8_2_1313ab2f_for_U local_1b0;
  uint local_1a8;
  anon_union_8_2_1313ab2f_for_U local_1a0;
  uint local_198;
  anon_union_8_2_1313ab2f_for_U local_190;
  uint local_188;
  anon_union_8_2_1313ab2f_for_U local_180;
  uint local_178;
  anon_union_8_2_1313ab2f_for_U local_170;
  uint local_168;
  anon_union_8_2_1313ab2f_for_U local_160;
  uint local_158;
  anon_union_8_2_1313ab2f_for_U local_150;
  uint local_148;
  anon_union_8_2_1313ab2f_for_U local_140;
  uint local_138;
  anon_union_8_2_1313ab2f_for_U local_130;
  uint local_128;
  anon_union_8_2_1313ab2f_for_U local_120;
  uint local_118;
  anon_union_8_2_1313ab2f_for_U local_110;
  uint local_108;
  anon_union_8_2_1313ab2f_for_U local_100;
  uint local_f8;
  anon_union_8_2_1313ab2f_for_U local_f0;
  uint local_e8;
  anon_union_8_2_1313ab2f_for_U local_e0;
  uint local_d8;
  anon_union_8_2_1313ab2f_for_U local_d0;
  uint local_c8;
  anon_union_8_2_1313ab2f_for_U local_c0;
  uint local_b8;
  anon_union_8_2_1313ab2f_for_U local_b0;
  uint local_a8;
  anon_union_8_2_1313ab2f_for_U local_a0;
  uint local_98;
  anon_union_8_2_1313ab2f_for_U local_90;
  uint local_88;
  anon_union_8_2_1313ab2f_for_U local_80;
  uint local_78;
  anon_union_8_2_1313ab2f_for_U local_70;
  uint local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  local_1c8 = 1;
  local_1d0.VAL = 0;
  local_48 = 1;
  local_50.VAL = 0;
  local_210 = 1;
  local_218.VAL = 0;
  local_1e8 = 1;
  local_1f0.VAL = 0;
  local_230 = 1;
  local_238.VAL = 0;
  local_220 = 1;
  local_228.VAL = 0;
  (__return_storage_ptr__->m).BitWidth = 1;
  (__return_storage_ptr__->m).U.VAL = 0;
  __return_storage_ptr__->a = false;
  local_1f8 = __return_storage_ptr__;
  APInt((APInt *)&local_1e0,this->BitWidth,0xffffffffffffffff,true);
  local_1b8 = local_1d8;
  if ((ulong)local_1d8 < 0x41) {
    local_1c0.VAL = local_1e0.VAL;
  }
  else {
    uVar6 = (ulong)((uint)((ulong)local_1d8 + 0x3f >> 3) & 0xfffffff8);
    local_1c0.pVal = (uint64_t *)operator_new__(uVar6);
    memcpy(local_1c0.pVal,local_1e0.pVal,uVar6);
  }
  lshrInPlace((APInt *)&local_1c0,LeadingZeros);
  if ((0x40 < local_1d8) && ((void *)local_1e0.VAL != (void *)0x0)) {
    operator_delete__(local_1e0.pVal);
  }
  uVar7 = this->BitWidth;
  APInt((APInt *)&local_1e0,uVar7,0,false);
  setBit((APInt *)&local_1e0,uVar7 - 1);
  uVar7 = this->BitWidth;
  APInt((APInt *)&local_60,uVar7,0xffffffffffffffff,true);
  clearBit((APInt *)&local_60,uVar7 - 1);
  local_68 = local_1b8;
  if ((ulong)local_1b8 < 0x41) {
    local_70.VAL = local_1c0.VAL;
  }
  else {
    uVar6 = (ulong)((uint)((ulong)local_1b8 + 0x3f >> 3) & 0xfffffff8);
    local_70.pVal = (uint64_t *)operator_new__(uVar6);
    memcpy(local_70.pVal,local_1c0.pVal,uVar6);
  }
  operator-=((APInt *)&local_70,this);
  local_38 = local_68;
  local_40.VAL = local_70.VAL;
  local_68 = 0;
  urem((APInt *)&local_208,(APInt *)&local_40);
  flipAllBits((APInt *)&local_208);
  operator++((APInt *)&local_208);
  operator+=((APInt *)&local_208,(APInt *)&local_1c0);
  local_240 = local_200;
  local_248.VAL = local_208.VAL;
  local_200 = 0;
  operator=((APInt *)&local_1d0,(APInt *)&local_248);
  if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_248.pVal);
  }
  if ((0x40 < local_200) && ((uint64_t *)local_208.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_208.pVal);
  }
  if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
    operator_delete__(local_40.pVal);
  }
  if ((0x40 < local_68) && ((void *)local_70.VAL != (void *)0x0)) {
    operator_delete__(local_70.pVal);
  }
  uVar7 = this->BitWidth;
  udiv((APInt *)&local_248,(APInt *)&local_1e0);
  operator=((APInt *)&local_218,(APInt *)&local_248);
  if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_248.pVal);
  }
  operator*((APInt *)&local_208,(APInt *)&local_218);
  flipAllBits((APInt *)&local_208);
  operator++((APInt *)&local_208);
  operator+=((APInt *)&local_208,(APInt *)&local_1e0);
  local_240 = local_200;
  local_248.VAL = local_208.VAL;
  local_200 = 0;
  operator=((APInt *)&local_1f0,(APInt *)&local_248);
  if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_248.pVal);
  }
  if ((0x40 < local_200) && ((uint64_t *)local_208.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_208.pVal);
  }
  udiv((APInt *)&local_248,(APInt *)&local_60);
  operator=((APInt *)&local_238,(APInt *)&local_248);
  if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_248.pVal);
  }
  operator*((APInt *)&local_208,(APInt *)&local_238);
  flipAllBits((APInt *)&local_208);
  operator++((APInt *)&local_208);
  operator+=((APInt *)&local_208,(APInt *)&local_60);
  local_240 = local_200;
  local_248.VAL = local_208.VAL;
  local_200 = 0;
  operator=((APInt *)&local_228,(APInt *)&local_248);
  if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_248.pVal);
  }
  if ((0x40 < local_200) && ((uint64_t *)local_208.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_208.pVal);
  }
  while( true ) {
    local_f8 = local_1c8;
    if ((ulong)local_1c8 < 0x41) {
      local_100.VAL = local_1d0.VAL;
    }
    else {
      uVar6 = (ulong)((uint)((ulong)local_1c8 + 0x3f >> 3) & 0xfffffff8);
      local_100.pVal = (uint64_t *)operator_new__(uVar6);
      memcpy(local_100.pVal,local_1d0.pVal,uVar6);
    }
    operator-=((APInt *)&local_100,(APInt *)&local_1f0);
    uVar2 = local_f8;
    local_240 = local_f8;
    local_248.VAL = local_100.VAL;
    local_f8 = 0;
    iVar5 = compare((APInt *)&local_1f0,(APInt *)&local_248);
    if ((0x40 < uVar2) && ((void *)local_248.VAL != (void *)0x0)) {
      operator_delete__(local_248.pVal);
    }
    if ((0x40 < local_f8) && ((uint64_t *)local_100.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_100.pVal);
    }
    if (iVar5 < 0) {
      local_128 = local_210;
      if ((ulong)local_210 < 0x41) {
        local_130.VAL = local_218.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_210 + 0x3f >> 3) & 0xfffffff8);
        local_130.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_130.pVal,local_218.pVal,uVar6);
      }
      operator+=((APInt *)&local_130,(APInt *)&local_218);
      local_240 = local_128;
      local_248.VAL = local_130.VAL;
      local_128 = 0;
      operator=((APInt *)&local_218,(APInt *)&local_248);
      if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_248.pVal);
      }
      if ((0x40 < local_128) && ((uint64_t *)local_130.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_130.pVal);
      }
      local_138 = local_1e8;
      if ((ulong)local_1e8 < 0x41) {
        local_140.VAL = local_1f0.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_1e8 + 0x3f >> 3) & 0xfffffff8);
        local_140.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_140.pVal,local_1f0.pVal,uVar6);
      }
      operator+=((APInt *)&local_140,(APInt *)&local_1f0);
      local_240 = local_138;
      local_248.VAL = local_140.VAL;
      local_138 = 0;
      operator=((APInt *)&local_1f0,(APInt *)&local_248);
      aVar1 = local_140;
      uVar2 = local_138;
      if ((0x40 < local_240) && ((void *)local_248.VAL != (void *)0x0)) {
        operator_delete__(local_248.pVal);
        aVar1 = local_140;
        uVar2 = local_138;
      }
    }
    else {
      local_108 = local_210;
      if ((ulong)local_210 < 0x41) {
        local_110.VAL = local_218.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_210 + 0x3f >> 3) & 0xfffffff8);
        local_110.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_110.pVal,local_218.pVal,uVar6);
      }
      operator+=((APInt *)&local_110,(APInt *)&local_218);
      local_88 = local_108;
      local_90.VAL = local_110.VAL;
      local_108 = 0;
      operator+=((APInt *)&local_90,1);
      local_240 = local_88;
      local_248.VAL = local_90.VAL;
      local_88 = 0;
      operator=((APInt *)&local_218,(APInt *)&local_248);
      if ((0x40 < local_240) && ((void *)local_248.VAL != (void *)0x0)) {
        operator_delete__(local_248.pVal);
      }
      if ((0x40 < local_88) && ((uint64_t *)local_90.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_90.pVal);
      }
      if ((0x40 < local_108) && ((uint64_t *)local_110.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_110.pVal);
      }
      local_118 = local_1e8;
      if ((ulong)local_1e8 < 0x41) {
        local_120.VAL = local_1f0.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_1e8 + 0x3f >> 3) & 0xfffffff8);
        local_120.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_120.pVal,local_1f0.pVal,uVar6);
      }
      operator+=((APInt *)&local_120,(APInt *)&local_1f0);
      local_98 = local_118;
      local_a0.VAL = local_120.VAL;
      local_118 = 0;
      operator-=((APInt *)&local_a0,(APInt *)&local_1d0);
      local_240 = local_98;
      local_248.VAL = local_a0.VAL;
      local_98 = 0;
      operator=((APInt *)&local_1f0,(APInt *)&local_248);
      if ((0x40 < local_240) && ((void *)local_248.VAL != (void *)0x0)) {
        operator_delete__(local_248.pVal);
      }
      aVar1 = local_120;
      uVar2 = local_118;
      if ((0x40 < local_98) && ((uint64_t *)local_a0.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_a0.pVal);
        aVar1 = local_120;
        uVar2 = local_118;
      }
    }
    if ((0x40 < uVar2) && ((uint64_t *)aVar1.VAL != (uint64_t *)0x0)) {
      operator_delete__(aVar1.pVal);
    }
    local_148 = local_220;
    if ((ulong)local_220 < 0x41) {
      local_150.VAL = local_228.VAL;
    }
    else {
      uVar6 = (ulong)((uint)((ulong)local_220 + 0x3f >> 3) & 0xfffffff8);
      local_150.pVal = (uint64_t *)operator_new__(uVar6);
      memcpy(local_150.pVal,local_228.pVal,uVar6);
    }
    operator+=((APInt *)&local_150,1);
    uVar2 = local_148;
    local_240 = local_148;
    local_248.VAL = local_150.VAL;
    local_148 = 0;
    local_158 = this->BitWidth;
    if ((ulong)local_158 < 0x41) {
      local_160 = (anon_union_8_2_1313ab2f_for_U)(this->U).pVal;
    }
    else {
      uVar6 = (ulong)((uint)((ulong)local_158 + 0x3f >> 3) & 0xfffffff8);
      local_160.pVal = (uint64_t *)operator_new__(uVar6);
      memcpy(local_160.pVal,(this->U).pVal,uVar6);
    }
    operator-=((APInt *)&local_160,(APInt *)&local_228);
    uVar3 = local_158;
    local_200 = local_158;
    local_208.VAL = local_160.VAL;
    local_158 = 0;
    iVar5 = compare((APInt *)&local_248,(APInt *)&local_208);
    if ((0x40 < uVar3) && ((uint64_t *)local_208.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_208.pVal);
    }
    if ((0x40 < local_158) && ((uint64_t *)local_160.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_160.pVal);
    }
    if ((0x40 < uVar2) && ((void *)local_248.VAL != (void *)0x0)) {
      operator_delete__(local_248.pVal);
    }
    if ((0x40 < local_148) && ((uint64_t *)local_150.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_150.pVal);
    }
    if (iVar5 < 0) {
      iVar5 = compare((APInt *)&local_238,(APInt *)&local_1e0);
      if (-1 < iVar5) {
        local_1f8->a = true;
      }
      local_188 = local_230;
      if ((ulong)local_230 < 0x41) {
        local_190.VAL = local_238.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_230 + 0x3f >> 3) & 0xfffffff8);
        local_190.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_190.pVal,local_238.pVal,uVar6);
      }
      operator+=((APInt *)&local_190,(APInt *)&local_238);
      local_240 = local_188;
      local_248.VAL = local_190.VAL;
      local_188 = 0;
      operator=((APInt *)&local_238,(APInt *)&local_248);
      if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_248.pVal);
      }
      if ((0x40 < local_188) && ((uint64_t *)local_190.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_190.pVal);
      }
      local_198 = local_220;
      if ((ulong)local_220 < 0x41) {
        local_1a0.VAL = local_228.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_220 + 0x3f >> 3) & 0xfffffff8);
        local_1a0.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_1a0.pVal,local_228.pVal,uVar6);
      }
      operator+=((APInt *)&local_1a0,(APInt *)&local_228);
      local_d8 = local_198;
      local_e0.VAL = local_1a0.VAL;
      local_198 = 0;
      operator+=((APInt *)&local_e0,1);
      local_240 = local_d8;
      local_248.VAL = local_e0.VAL;
      local_d8 = 0;
      operator=((APInt *)&local_228,(APInt *)&local_248);
      if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_248.pVal);
      }
      aVar1 = local_1a0;
      uVar2 = local_198;
      if ((0x40 < local_d8) && ((uint64_t *)local_e0.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_e0.pVal);
        aVar1 = local_1a0;
        uVar2 = local_198;
      }
    }
    else {
      iVar5 = compare((APInt *)&local_238,(APInt *)&local_60);
      if (-1 < iVar5) {
        local_1f8->a = true;
      }
      local_168 = local_230;
      if ((ulong)local_230 < 0x41) {
        local_170.VAL = local_238.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_230 + 0x3f >> 3) & 0xfffffff8);
        local_170.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_170.pVal,local_238.pVal,uVar6);
      }
      operator+=((APInt *)&local_170,(APInt *)&local_238);
      local_a8 = local_168;
      local_b0.VAL = local_170.VAL;
      local_168 = 0;
      operator+=((APInt *)&local_b0,1);
      local_240 = local_a8;
      local_248.VAL = local_b0.VAL;
      local_a8 = 0;
      operator=((APInt *)&local_238,(APInt *)&local_248);
      if ((0x40 < local_240) && ((void *)local_248.VAL != (void *)0x0)) {
        operator_delete__(local_248.pVal);
      }
      if ((0x40 < local_a8) && ((uint64_t *)local_b0.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_b0.pVal);
      }
      if ((0x40 < local_168) && ((uint64_t *)local_170.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_170.pVal);
      }
      local_178 = local_220;
      if ((ulong)local_220 < 0x41) {
        local_180.VAL = local_228.VAL;
      }
      else {
        uVar6 = (ulong)((uint)((ulong)local_220 + 0x3f >> 3) & 0xfffffff8);
        local_180.pVal = (uint64_t *)operator_new__(uVar6);
        memcpy(local_180.pVal,local_228.pVal,uVar6);
      }
      operator+=((APInt *)&local_180,(APInt *)&local_228);
      local_c8 = local_178;
      local_d0.VAL = local_180.VAL;
      local_178 = 0;
      operator+=((APInt *)&local_d0,1);
      local_b8 = local_c8;
      local_c0.VAL = local_d0.VAL;
      local_c8 = 0;
      operator-=((APInt *)&local_c0,this);
      local_240 = local_b8;
      local_248.VAL = local_c0.VAL;
      local_b8 = 0;
      operator=((APInt *)&local_228,(APInt *)&local_248);
      if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_248.pVal);
      }
      if ((0x40 < local_b8) && ((uint64_t *)local_c0.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_c0.pVal);
      }
      aVar1 = local_180;
      uVar2 = local_178;
      if ((0x40 < local_c8) && ((uint64_t *)local_d0.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_d0.pVal);
        aVar1 = local_180;
        uVar2 = local_178;
      }
    }
    if ((0x40 < uVar2) && ((uint64_t *)aVar1.VAL != (uint64_t *)0x0)) {
      operator_delete__(aVar1.pVal);
    }
    local_1a8 = this->BitWidth;
    if ((ulong)local_1a8 < 0x41) {
      local_1b0 = this->U;
    }
    else {
      uVar6 = (ulong)((uint)((ulong)local_1a8 + 0x3f >> 3) & 0xfffffff8);
      local_1b0.pVal = (uint64_t *)operator_new__(uVar6);
      memcpy(local_1b0.pVal,(this->U).pVal,uVar6);
    }
    operator-=((APInt *)&local_1b0,1);
    local_e8 = local_1a8;
    local_f0.VAL = local_1b0.VAL;
    local_1a8 = 0;
    operator-=((APInt *)&local_f0,(APInt *)&local_228);
    local_240 = local_e8;
    local_248.VAL = local_f0.VAL;
    local_e8 = 0;
    operator=((APInt *)&local_50,(APInt *)&local_248);
    if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_248.pVal);
    }
    if ((0x40 < local_e8) && ((uint64_t *)local_f0.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_f0.pVal);
    }
    if ((0x40 < local_1a8) && ((uint64_t *)local_1b0.VAL != (uint64_t *)0x0)) {
      operator_delete__(local_1b0.pVal);
    }
    if ((this->BitWidth * 2 <= uVar7) ||
       ((iVar5 = compare((APInt *)&local_218,(APInt *)&local_50), -1 < iVar5 &&
        ((bVar4 = operator==((APInt *)&local_218,(APInt *)&local_50), !bVar4 ||
         (bVar4 = operator==((APInt *)&local_1f0,0), !bVar4)))))) break;
    uVar7 = uVar7 + 1;
  }
  local_78 = local_230;
  if ((ulong)local_230 < 0x41) {
    local_80.VAL = local_238.VAL;
  }
  else {
    uVar6 = (ulong)((uint)((ulong)local_230 + 0x3f >> 3) & 0xfffffff8);
    local_80.pVal = (uint64_t *)operator_new__(uVar6);
    memcpy(local_80.pVal,local_238.pVal,uVar6);
  }
  operator+=((APInt *)&local_80,1);
  local_240 = local_78;
  local_248.VAL = local_80.VAL;
  local_78 = 0;
  operator=(&local_1f8->m,(APInt *)&local_248);
  if ((0x40 < local_240) && ((uint64_t *)local_248.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_248.pVal);
  }
  if ((0x40 < local_78) && ((uint64_t *)local_80.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_80.pVal);
  }
  local_1f8->s = uVar7 - this->BitWidth;
  if ((0x40 < local_58) && ((void *)local_60.VAL != (void *)0x0)) {
    operator_delete__(local_60.pVal);
  }
  if ((0x40 < local_1d8) && ((void *)local_1e0.VAL != (void *)0x0)) {
    operator_delete__(local_1e0.pVal);
  }
  if ((0x40 < local_1b8) && ((void *)local_1c0.VAL != (void *)0x0)) {
    operator_delete__(local_1c0.pVal);
  }
  if ((0x40 < local_220) && ((uint64_t *)local_228.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_228.pVal);
  }
  if ((0x40 < local_230) && ((uint64_t *)local_238.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_238.pVal);
  }
  if ((0x40 < local_1e8) && ((uint64_t *)local_1f0.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_1f0.pVal);
  }
  if ((0x40 < local_210) && ((uint64_t *)local_218.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_218.pVal);
  }
  if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
    operator_delete__(local_50.pVal);
  }
  if ((0x40 < local_1c8) && ((uint64_t *)local_1d0.VAL != (uint64_t *)0x0)) {
    operator_delete__(local_1d0.pVal);
  }
  return local_1f8;
}

Assistant:

APInt::mu APInt::magicu(unsigned LeadingZeros) const {
  const APInt& d = *this;
  unsigned p;
  APInt nc, delta, q1, r1, q2, r2;
  struct mu magu;
  magu.a = 0;               // initialize "add" indicator
  APInt allOnes = APInt::getAllOnesValue(d.getBitWidth()).lshr(LeadingZeros);
  APInt signedMin = APInt::getSignedMinValue(d.getBitWidth());
  APInt signedMax = APInt::getSignedMaxValue(d.getBitWidth());

  nc = allOnes - (allOnes - d).urem(d);
  p = d.getBitWidth() - 1;  // initialize p
  q1 = signedMin.udiv(nc);  // initialize q1 = 2p/nc
  r1 = signedMin - q1*nc;   // initialize r1 = rem(2p,nc)
  q2 = signedMax.udiv(d);   // initialize q2 = (2p-1)/d
  r2 = signedMax - q2*d;    // initialize r2 = rem((2p-1),d)
  do {
    p = p + 1;
    if (r1.uge(nc - r1)) {
      q1 = q1 + q1 + 1;  // update q1
      r1 = r1 + r1 - nc; // update r1
    }
    else {
      q1 = q1+q1; // update q1
      r1 = r1+r1; // update r1
    }
    if ((r2 + 1).uge(d - r2)) {
      if (q2.uge(signedMax)) magu.a = 1;
      q2 = q2+q2 + 1;     // update q2
      r2 = r2+r2 + 1 - d; // update r2
    }
    else {
      if (q2.uge(signedMin)) magu.a = 1;
      q2 = q2+q2;     // update q2
      r2 = r2+r2 + 1; // update r2
    }
    delta = d - 1 - r2;
  } while (p < d.getBitWidth()*2 &&
           (q1.ult(delta) || (q1 == delta && r1 == 0)));
  magu.m = q2 + 1; // resulting magic number
  magu.s = p - d.getBitWidth();  // resulting shift
  return magu;
}